

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# miniaudio.c
# Opt level: O0

ma_result ma_job_queue_next(ma_job_queue *pQueue,ma_job *pJob)

{
  ulong expected;
  ulong uVar1;
  ma_bool32 mVar2;
  ma_uint64 next;
  ma_uint64 tail;
  ma_uint64 head;
  ma_job *pJob_local;
  ma_job_queue *pQueue_local;
  
  if ((pQueue == (ma_job_queue *)0x0) || (pJob == (ma_job *)0x0)) {
    pQueue_local._4_4_ = MA_INVALID_ARGS;
  }
  else {
    if ((pQueue->flags & 1) == 0) {
      ma_semaphore_wait(&pQueue->sem);
    }
    ma_spinlock_lock(&pQueue->lock);
    do {
      while( true ) {
        do {
          expected = pQueue->head;
          uVar1 = pQueue->pJobs[expected & 0xffff].next;
        } while ((expected & 0xffffffff0000ffff) != (pQueue->head & 0xffffffff0000ffff));
        if ((short)expected != (short)pQueue->tail) break;
        if ((short)uVar1 == -1) {
          ma_spinlock_unlock(&pQueue->lock);
          return MA_NO_DATA_AVAILABLE;
        }
        ma_job_queue_cas(&pQueue->tail,pQueue->tail,uVar1 & 0xffff);
      }
      memcpy(pJob,pQueue->pJobs + (uVar1 & 0xffff),0x68);
      mVar2 = ma_job_queue_cas(&pQueue->head,expected,uVar1 & 0xffff);
    } while (mVar2 == 0);
    ma_spinlock_unlock(&pQueue->lock);
    ma_slot_allocator_free(&pQueue->allocator,expected);
    if ((pJob->toc).breakup.code == 0) {
      ma_job_queue_post(pQueue,pJob);
      pQueue_local._4_4_ = MA_CANCELLED;
    }
    else {
      pQueue_local._4_4_ = MA_SUCCESS;
    }
  }
  return pQueue_local._4_4_;
}

Assistant:

MA_API ma_result ma_job_queue_next(ma_job_queue* pQueue, ma_job* pJob)
{
    ma_uint64 head;
    ma_uint64 tail;
    ma_uint64 next;

    if (pQueue == NULL || pJob == NULL) {
        return MA_INVALID_ARGS;
    }

    /* If we're running in synchronous mode we'll need to wait on a semaphore. */
    if ((pQueue->flags & MA_JOB_QUEUE_FLAG_NON_BLOCKING) == 0) {
        #ifndef MA_NO_THREADING
        {
            ma_semaphore_wait(&pQueue->sem);
        }
        #else
        {
            MA_ASSERT(MA_FALSE);    /* Should never get here. Should have been checked at initialization time. */
        }
        #endif
    }

    #ifndef MA_USE_EXPERIMENTAL_LOCK_FREE_JOB_QUEUE
    ma_spinlock_lock(&pQueue->lock);
    #endif
    {
        /*
        BUG: In lock-free mode, multiple threads can be in this section of code. The "head" variable in the loop below
        is stored. One thread can fall through to the freeing of this item while another is still using "head" for the
        retrieval of the "next" variable.

        The slot allocator might need to make use of some reference counting to ensure it's only truely freed when
        there are no more references to the item. This must be fixed before removing these locks.
        */

        /* Now we need to remove the root item from the list. */
        for (;;) {
            head = c89atomic_load_64(&pQueue->head);
            tail = c89atomic_load_64(&pQueue->tail);
            next = c89atomic_load_64(&pQueue->pJobs[ma_job_extract_slot(head)].next);

            if (ma_job_toc_to_allocation(head) == ma_job_toc_to_allocation(c89atomic_load_64(&pQueue->head))) {
                if (ma_job_extract_slot(head) == ma_job_extract_slot(tail)) {
                    if (ma_job_extract_slot(next) == 0xFFFF) {
                        #ifndef MA_USE_EXPERIMENTAL_LOCK_FREE_JOB_QUEUE
                        ma_spinlock_unlock(&pQueue->lock);
                        #endif
                        return MA_NO_DATA_AVAILABLE;
                    }
                    ma_job_queue_cas(&pQueue->tail, tail, ma_job_extract_slot(next));
                } else {
                    *pJob = pQueue->pJobs[ma_job_extract_slot(next)];
                    if (ma_job_queue_cas(&pQueue->head, head, ma_job_extract_slot(next))) {
                        break;
                    }
                }
            }
        }
    }
    #ifndef MA_USE_EXPERIMENTAL_LOCK_FREE_JOB_QUEUE
    ma_spinlock_unlock(&pQueue->lock);
    #endif

    ma_slot_allocator_free(&pQueue->allocator, head);

    /*
    If it's a quit job make sure it's put back on the queue to ensure other threads have an opportunity to detect it and terminate naturally. We
    could instead just leave it on the queue, but that would involve fiddling with the lock-free code above and I want to keep that as simple as
    possible.
    */
    if (pJob->toc.breakup.code == MA_JOB_TYPE_QUIT) {
        ma_job_queue_post(pQueue, pJob);
        return MA_CANCELLED;    /* Return a cancelled status just in case the thread is checking return codes and not properly checking for a quit job. */
    }

    return MA_SUCCESS;
}